

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal-info.c
# Opt level: O2

int main(int argc,char **argv)

{
  int32_t iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  wal_q2_header *pwVar5;
  ulong uVar6;
  byte bVar7;
  char acStack_a98 [4];
  undefined1 local_a94 [28];
  uint local_a78;
  uint local_a74;
  uint local_a70 [4];
  undefined1 local_a60 [24];
  undefined1 local_a48 [8];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a28;
  uint local_a24;
  byte abStack_a20 [768];
  uint local_720;
  char buffer [892];
  wal_q2_header header_q2;
  
  bVar7 = 0;
  pcVar2 = cli_concat_args(argc,argv);
  if (argc < 2) {
    puts("Usage: wal-info texture.wal");
    return -1;
  }
  if (pcVar2 != (char *)0x0) {
    __stream = fopen(pcVar2,"r");
    if (__stream == (FILE *)0x0) {
      perror("Could not open file");
    }
    else {
      sVar3 = fread(buffer,1,0x37c,__stream);
      if (99 < sVar3) {
        iVar1 = wal_get_type((uchar *)buffer);
        if (iVar1 == 2) {
          wal_dk_read_header((uchar *)buffer,(wal_dk_header *)&header_q2);
          puts("Type: Daikatana");
          memcpy(acStack_a98,(wal_dk_header *)&header_q2,0x37c);
          printf("Name: %.*s\n",0x20,local_a94);
          printf("Width: %d\n",(ulong)local_a74);
          printf("Height: %d\n",(ulong)local_a70[0]);
          for (uVar6 = 0; uVar6 != 9; uVar6 = uVar6 + 1) {
            printf("MIP %d offset: %#010x\n",uVar6 & 0xffffffff,(ulong)local_a70[uVar6 + 1]);
          }
          printf("Next frame name: %.*s\n",0x20,local_a48);
          printf("Flags: %#010x\n",(ulong)local_a28);
          printf("Contents: %#010x\n",(ulong)local_a24);
          printf("Value: %#010x\n",(ulong)local_720);
          puts("Palette:");
          for (uVar6 = 0; uVar6 < 0x100; uVar6 = uVar6 + 3) {
            printf("#%02x%02x%02x\n",(ulong)abStack_a20[uVar6],(ulong)abStack_a20[uVar6 + 1],
                   (ulong)abStack_a20[uVar6 + 2]);
          }
        }
        else {
          if (iVar1 != 1) {
            puts("File type not supported - check if it\'s really a WAL");
            goto LAB_00102549;
          }
          wal_q2_read_header((uchar *)buffer,&header_q2);
          puts("Type: Quake 2");
          pwVar5 = &header_q2;
          pcVar2 = acStack_a98;
          for (lVar4 = 100; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pcVar2 = pwVar5->name[0];
            pwVar5 = (wal_q2_header *)((long)pwVar5 + (ulong)bVar7 * -2 + 1);
            pcVar2 = pcVar2 + (ulong)bVar7 * -2 + 1;
          }
          printf("Name: %.*s\n",0x20,acStack_a98);
          printf("Width: %d\n",(ulong)local_a78);
          printf("Height: %d\n",(ulong)local_a74);
          for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
            printf("MIP %d offset: %#010x\n",uVar6 & 0xffffffff,(ulong)local_a70[uVar6]);
          }
          printf("Next frame name: %.*s\n",0x20,local_a60);
          printf("Flags: %#010x\n",(ulong)local_a40);
          printf("Contents: %#010x\n",(ulong)local_a3c);
          printf("Value: %#010x\n",(ulong)local_a38);
        }
        fclose(__stream);
        return 0;
      }
      fwrite("Unable to read enough bytes to parse the header\n",0x30,1,_stderr);
    }
  }
LAB_00102549:
  printf("File path: %s\n",pcVar2);
  return 1;
}

Assistant:

int main(int argc, const char *argv[])
{
	FILE *fp;
	struct wal_q2_header header_q2;
	struct wal_dk_header header_dk;
	char *path = cli_concat_args(argc, argv);
	char buffer[WAL_DK_HEADER_SIZE]; /* Daikatana's header is bigger */
	const unsigned char *buf_ptr = (const unsigned char *)&buffer;

	if (argc < 2) {
		printf("Usage: wal-info texture.wal\n");
		return -1;
	}
	if (!path) {
		goto on_err;
	}
	fp = fopen(path, "r");
	if (!fp) {
		perror("Could not open file");
		goto on_err;
	}
	size_t total_len = fread(&buffer, 1, WAL_DK_HEADER_SIZE, fp);
	if (total_len < WAL_Q2_HEADER_SIZE) {
		fprintf(stderr, "Unable to read enough bytes to parse the header\n");
		goto on_err;
	}
	int32_t type = wal_get_type(buf_ptr);
	switch (type) {
		case WAL_TYPE_QUAKE2:
			wal_q2_read_header(buf_ptr, &header_q2);
			printf("Type: Quake 2\n");
			print_info_q2(header_q2);
			break;
		case WAL_TYPE_DAIKATANA:
			wal_dk_read_header(buf_ptr, &header_dk);
			printf("Type: Daikatana\n");
			print_info_dk(header_dk);
			break;
		default:
			printf("File type not supported - check if it's really a WAL\n");
			goto on_err;
	}
	fclose(fp);
	return 0;

on_err:
	printf("File path: %s\n", path);
	return 1;
}